

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::BlitNearestFilterConsistencyCase::compare
          (BlitNearestFilterConsistencyCase *this,Surface *reference,Surface *result)

{
  allocator<bool> *this_00;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  RGBA threshold_00;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  RGBA RVar10;
  RenderTarget *this_01;
  PixelFormat *this_02;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  IVec4 *this_03;
  reference rVar13;
  bool local_f36;
  allocator<char> local_e31;
  string local_e30;
  allocator<char> local_e09;
  string local_e08;
  LogImage local_de8;
  allocator<char> local_d51;
  string local_d50;
  allocator<char> local_d29;
  string local_d28;
  LogImageSet local_d08;
  MessageBuilder local_cc8;
  allocator<char> local_b41;
  string local_b40;
  allocator<char> local_b19;
  string local_b18;
  LogImage local_af8;
  allocator<char> local_a61;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  LogImage local_a18;
  allocator<char> local_981;
  string local_980;
  allocator<char> local_959;
  string local_958;
  LogImageSet local_938;
  MessageBuilder local_8f8;
  deUint32 local_774;
  reference local_770;
  reference local_760;
  undefined1 local_74d;
  deUint32 local_74c;
  RGBA RStack_748;
  bool correctSign;
  deUint32 local_744;
  byte local_73d;
  deUint32 local_73c;
  int iStack_738;
  bool resultSign;
  RGBA color_3;
  int dx_2;
  int dy_2;
  _Bit_type local_728;
  deUint32 local_71c;
  deUint32 local_718;
  deUint32 local_714;
  reference local_710;
  deUint32 local_6fc;
  deUint32 local_6f8;
  deUint32 local_6f4;
  RGBA local_6f0;
  int local_6ec;
  RGBA color_2;
  int dy_1;
  reference local_6c8;
  deUint32 local_6b4;
  deUint32 local_6b0;
  deUint32 local_6ac;
  RGBA local_6a8;
  int local_6a4;
  RGBA color_1;
  int dx_1;
  string local_698;
  allocator<char> local_671;
  string local_670;
  LogImage local_650;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  LogImage local_570;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  LogImageSet local_490;
  MessageBuilder local_450;
  deUint32 local_2cc;
  deUint32 local_2c8;
  deUint32 local_2c4;
  deUint32 local_2c0;
  deUint32 local_2bc;
  deUint32 local_2b8;
  deUint32 local_2b4;
  bool local_2ad;
  RGBA local_2ac;
  int iStack_2a8;
  bool isValidColor;
  RGBA color;
  int dx;
  int dy;
  Vector<float,_4> local_120;
  PixelBufferAccess local_110;
  allocator<bool> local_e1;
  undefined1 local_e0 [8];
  vector<bool,_std::allocator<bool>_> verticalSign;
  undefined1 local_a8 [8];
  vector<bool,_std::allocator<bool>_> horisontalSign;
  Surface errorMask;
  bool error;
  undefined1 local_4c [3];
  bool signConfig;
  RGBA baseColor;
  IVec4 destinationArea;
  RGBA local_30;
  RGBA threshold;
  RGBA cellColorB;
  RGBA cellColorA;
  Surface *result_local;
  Surface *reference_local;
  BlitNearestFilterConsistencyCase *this_local;
  
  tcu::RGBA::RGBA(&threshold,&(this->super_BlitRectCase).m_gridCellColorA);
  tcu::RGBA::RGBA(&local_30,&(this->super_BlitRectCase).m_gridCellColorB);
  this_01 = Context::getRenderTarget
                      ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.m_context);
  this_02 = tcu::RenderTarget::getPixelFormat(this_01);
  destinationArea.m_data[3] = (int)tcu::PixelFormat::getColorThreshold(this_02);
  tcu::RGBA::RGBA((RGBA *)(destinationArea.m_data + 2),7,7,7,7);
  threshold_00 = tcu::operator+((RGBA *)(destinationArea.m_data + 3),
                                (RGBA *)(destinationArea.m_data + 2));
  this_03 = &(this->super_BlitRectCase).m_dstRect;
  iVar5 = tcu::Vector<int,_4>::x(this_03);
  iVar6 = tcu::Vector<int,_4>::z(this_03);
  iVar5 = de::min<int>(iVar5,iVar6);
  iVar6 = tcu::Surface::getWidth(result);
  iVar5 = de::clamp<int>(iVar5,0,iVar6);
  iVar6 = tcu::Vector<int,_4>::y(this_03);
  iVar7 = tcu::Vector<int,_4>::w(this_03);
  iVar6 = de::min<int>(iVar6,iVar7);
  iVar7 = tcu::Surface::getHeight(result);
  iVar6 = de::clamp<int>(iVar6,0,iVar7);
  iVar7 = tcu::Vector<int,_4>::x(this_03);
  iVar8 = tcu::Vector<int,_4>::z(this_03);
  iVar7 = de::max<int>(iVar7,iVar8);
  iVar8 = tcu::Surface::getWidth(result);
  iVar7 = de::clamp<int>(iVar7,0,iVar8);
  iVar8 = tcu::Vector<int,_4>::y(this_03);
  iVar9 = tcu::Vector<int,_4>::w(this_03);
  iVar8 = de::max<int>(iVar8,iVar9);
  iVar9 = tcu::Surface::getHeight(result);
  iVar8 = de::clamp<int>(iVar8,0,iVar9);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_4c,iVar5,iVar6,iVar7,iVar8);
  iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
  iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
  RVar10 = tcu::Surface::getPixel(result,iVar5,iVar6);
  bVar2 = tcu::compareThreshold(RVar10,threshold,threshold_00);
  bVar4 = false;
  iVar5 = tcu::Surface::getWidth(result);
  iVar6 = tcu::Surface::getHeight(result);
  tcu::Surface::Surface
            ((Surface *)
             &horisontalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,iVar5,iVar6);
  iVar5 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_4c);
  iVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
  this_00 = (allocator<bool> *)
            ((long)&verticalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + 3);
  std::allocator<bool>::allocator(this_00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_a8,(long)(iVar5 - iVar6),this_00);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&verticalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 3));
  iVar5 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_4c);
  iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
  std::allocator<bool>::allocator(&local_e1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_e0,(long)(iVar5 - iVar6),&local_e1);
  std::allocator<bool>::~allocator(&local_e1);
  tcu::Surface::getAccess
            (&local_110,
             (Surface *)
             &horisontalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  tcu::Vector<float,_4>::Vector(&local_120,0.0,1.0,0.0,1.0);
  tcu::clear(&local_110,&local_120);
  pTVar11 = tcu::TestContext::getLog
                      ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&dx,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&dx,
                       (char (*) [60])"Verifying consistency of NEAREST filtering. Verifying rect ")
  ;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&(this->super_BlitRectCase).m_dstRect);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x130f3e5);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (pMVar12,(char (*) [124])
                               "Rounding direction of the NEAREST filter at the horisontal texel edge (x = n + 0.5) should not depend on the y-coordinate.\n"
                      );
  pMVar12 = tcu::MessageBuilder::operator<<
                      (pMVar12,(char (*) [122])
                               "Rounding direction of the NEAREST filter at the vertical texel edge (y = n + 0.5) should not depend on the x-coordinate.\n"
                      );
  pMVar12 = tcu::MessageBuilder::operator<<
                      (pMVar12,(char (*) [99])
                               "Blitting a grid (with uniform sized cells) should result in a grid (with non-uniform sized cells)."
                      );
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&dx);
  color.m_value = 0;
  while( true ) {
    RVar10.m_value = color.m_value;
    iVar5 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_4c);
    iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
    if (iVar5 - iVar6 <= (int)RVar10.m_value) break;
    iStack_2a8 = 0;
    while( true ) {
      iVar5 = iStack_2a8;
      iVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_4c);
      iVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
      if (iVar6 - iVar7 <= iVar5) break;
      iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
      iVar5 = iVar5 + iStack_2a8;
      iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
      local_2b4 = (deUint32)tcu::Surface::getPixel(result,iVar5,iVar6 + color.m_value);
      local_2b8 = threshold.m_value;
      local_2bc = threshold_00.m_value;
      local_2ac = (RGBA)local_2b4;
      bVar3 = tcu::compareThreshold((RGBA)local_2b4,threshold,threshold_00);
      local_f36 = true;
      if (!bVar3) {
        local_2c0 = local_2ac.m_value;
        local_2c4 = local_30.m_value;
        local_2c8 = threshold_00.m_value;
        local_f36 = tcu::compareThreshold(local_2ac,local_30,threshold_00);
      }
      local_2ad = local_f36;
      if (local_f36 == false) {
        iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
        iVar5 = iVar5 + iStack_2a8;
        iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
        iVar6 = iVar6 + color.m_value;
        local_2cc = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel
                  ((Surface *)
                   &horisontalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,iVar5,iVar6,(RGBA)local_2cc);
        bVar4 = true;
      }
      iStack_2a8 = iStack_2a8 + 1;
    }
    color.m_value = color.m_value + 1;
  }
  if (bVar4) {
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_450,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_450,
                         (char (*) [73])
                         "Image verification failed, destination rect contains unexpected values. ")
    ;
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [17])"Expected either ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&threshold);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [5])" or ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_30);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x128e7c9);
    pTVar11 = tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"Result",&local_4b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"Image verification result",&local_4d9);
    tcu::LogImageSet::LogImageSet(&local_490,&local_4b0,&local_4d8);
    pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_490);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"Result",&local_591);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"Result",&local_5b9);
    tcu::LogImage::LogImage(&local_570,&local_590,&local_5b8,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_570);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"ErrorMask",&local_671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"Error mask",(allocator<char> *)((long)&dx_1 + 3));
    tcu::LogImage::LogImage
              (&local_650,&local_670,&local_698,
               (Surface *)
               &horisontalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_650);
    tcu::TestLog::operator<<(pTVar11,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_650);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dx_1 + 3));
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    tcu::LogImage::~LogImage(&local_570);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator(&local_5b9);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
    tcu::LogImageSet::~LogImageSet(&local_490);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    tcu::MessageBuilder::~MessageBuilder(&local_450);
    this_local._7_1_ = false;
  }
  else {
    local_6a4 = 0;
    while( true ) {
      iVar5 = local_6a4;
      iVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_4c);
      iVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
      if (iVar6 - iVar7 <= iVar5) break;
      iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
      iVar5 = iVar5 + local_6a4;
      iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
      local_6ac = (deUint32)tcu::Surface::getPixel(result,iVar5,iVar6);
      local_6b0 = threshold.m_value;
      local_6b4 = threshold_00.m_value;
      local_6a8 = (RGBA)local_6ac;
      bVar4 = tcu::compareThreshold((RGBA)local_6ac,threshold,threshold_00);
      if (bVar4) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_a8,(long)local_6a4);
        local_6c8 = rVar13;
        std::_Bit_reference::operator=(&local_6c8,true);
      }
      else {
        bVar4 = tcu::compareThreshold(local_6a8,local_30,threshold_00);
        if (bVar4) {
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_a8,(long)local_6a4);
          _color_2 = rVar13._M_p;
          std::_Bit_reference::operator=((_Bit_reference *)&color_2,false);
        }
      }
      local_6a4 = local_6a4 + 1;
    }
    local_6ec = 0;
    while( true ) {
      iVar5 = local_6ec;
      iVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_4c);
      iVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
      if (iVar6 - iVar7 <= iVar5) break;
      iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
      iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
      local_6f4 = (deUint32)tcu::Surface::getPixel(result,iVar5,iVar6 + local_6ec);
      local_6f8 = threshold.m_value;
      local_6fc = threshold_00.m_value;
      local_6f0 = (RGBA)local_6f4;
      bVar4 = tcu::compareThreshold((RGBA)local_6f4,threshold,threshold_00);
      if (bVar4) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_e0,(long)local_6ec);
        local_710 = rVar13;
        std::_Bit_reference::operator=(&local_710,true);
      }
      else {
        local_714 = local_6f0.m_value;
        local_718 = local_30.m_value;
        local_71c = threshold_00.m_value;
        bVar4 = tcu::compareThreshold(local_6f0,local_30,threshold_00);
        if (bVar4) {
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_e0,(long)local_6ec);
          _dx_2 = rVar13;
          std::_Bit_reference::operator=((_Bit_reference *)&dx_2,false);
        }
      }
      local_6ec = local_6ec + 1;
    }
    color_3.m_value = 0;
    bVar1 = 0;
    while( true ) {
      RVar10.m_value = color_3.m_value;
      iVar5 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_4c);
      iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
      if (iVar5 - iVar6 <= (int)RVar10.m_value) break;
      iStack_738 = 0;
      while( true ) {
        iVar5 = iStack_738;
        iVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_4c);
        iVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
        if (iVar6 - iVar7 <= iVar5) break;
        iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
        iVar5 = iVar5 + iStack_738;
        iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
        RStack_748 = tcu::Surface::getPixel(result,iVar5,iVar6 + color_3.m_value);
        local_744 = threshold.m_value;
        local_74c = threshold_00.m_value;
        local_73c = RStack_748.m_value;
        local_73d = tcu::compareThreshold(threshold,RStack_748,threshold_00);
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_a8,(long)iStack_738);
        local_760 = rVar13;
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_e0,
                            (long)(int)color_3.m_value);
        local_770 = rVar13;
        bVar4 = std::_Bit_reference::operator==(&local_760,&local_770);
        local_74d = bVar4 == bVar2;
        if ((local_73d & 1) != local_74d) {
          iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4c);
          iVar5 = iVar5 + iStack_738;
          iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4c);
          iVar6 = iVar6 + color_3.m_value;
          local_774 = (deUint32)tcu::RGBA::red();
          tcu::Surface::setPixel
                    ((Surface *)
                     &horisontalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,iVar5,iVar6,(RGBA)local_774);
          bVar1 = 1;
        }
        iStack_738 = iStack_738 + 1;
      }
      color_3.m_value = color_3.m_value + 1;
    }
    if (bVar1 == 0) {
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_cc8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_cc8,(char (*) [27])"Image verification passed.");
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"Result",&local_d29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d50,"Image verification result",&local_d51);
      tcu::LogImageSet::LogImageSet(&local_d08,&local_d28,&local_d50);
      pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_d08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e08,"Result",&local_e09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e30,"Result",&local_e31);
      tcu::LogImage::LogImage
                (&local_de8,&local_e08,&local_e30,result,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_de8);
      tcu::TestLog::operator<<(pTVar11,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_de8);
      std::__cxx11::string::~string((string *)&local_e30);
      std::allocator<char>::~allocator(&local_e31);
      std::__cxx11::string::~string((string *)&local_e08);
      std::allocator<char>::~allocator(&local_e09);
      tcu::LogImageSet::~LogImageSet(&local_d08);
      std::__cxx11::string::~string((string *)&local_d50);
      std::allocator<char>::~allocator(&local_d51);
      std::__cxx11::string::~string((string *)&local_d28);
      std::allocator<char>::~allocator(&local_d29);
      tcu::MessageBuilder::~MessageBuilder(&local_cc8);
    }
    else {
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_8f8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_8f8,
                           (char (*) [61])
                           "Image verification failed, nearest filter is not consistent.");
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_958,"Result",&local_959);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_980,"Image verification result",&local_981);
      tcu::LogImageSet::LogImageSet(&local_938,&local_958,&local_980);
      pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_938);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"Result",&local_a39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a60,"Result",&local_a61);
      tcu::LogImage::LogImage
                (&local_a18,&local_a38,&local_a60,result,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_a18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b18,"ErrorMask",&local_b19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b40,"Error mask",&local_b41);
      tcu::LogImage::LogImage
                (&local_af8,&local_b18,&local_b40,
                 (Surface *)
                 &horisontalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_af8);
      tcu::TestLog::operator<<(pTVar11,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_af8);
      std::__cxx11::string::~string((string *)&local_b40);
      std::allocator<char>::~allocator(&local_b41);
      std::__cxx11::string::~string((string *)&local_b18);
      std::allocator<char>::~allocator(&local_b19);
      tcu::LogImage::~LogImage(&local_a18);
      std::__cxx11::string::~string((string *)&local_a60);
      std::allocator<char>::~allocator(&local_a61);
      std::__cxx11::string::~string((string *)&local_a38);
      std::allocator<char>::~allocator(&local_a39);
      tcu::LogImageSet::~LogImageSet(&local_938);
      std::__cxx11::string::~string((string *)&local_980);
      std::allocator<char>::~allocator(&local_981);
      std::__cxx11::string::~string((string *)&local_958);
      std::allocator<char>::~allocator(&local_959);
      tcu::MessageBuilder::~MessageBuilder(&local_8f8);
    }
    this_local._7_1_ = (bool)(bVar1 ^ 1);
  }
  color_1.m_value = 1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_e0)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_a8)
  ;
  tcu::Surface::~Surface
            ((Surface *)
             &horisontalSign.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool BlitNearestFilterConsistencyCase::compare (const tcu::Surface& reference, const tcu::Surface& result)
{
	DE_ASSERT(reference.getWidth() == result.getWidth());
	DE_ASSERT(reference.getHeight() == result.getHeight());
	DE_UNREF(reference);

	// Image origin must be visible (for baseColor)
	DE_ASSERT(de::min(m_dstRect.x(), m_dstRect.z()) >= 0);
	DE_ASSERT(de::min(m_dstRect.y(), m_dstRect.w()) >= 0);

	const tcu::RGBA		cellColorA		(m_gridCellColorA);
	const tcu::RGBA		cellColorB		(m_gridCellColorB);
	const tcu::RGBA		threshold		= TestCase::m_context.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(7,7,7,7);
	const tcu::IVec4	destinationArea	= tcu::IVec4(de::clamp(de::min(m_dstRect.x(), m_dstRect.z()), 0, result.getWidth()),
													 de::clamp(de::min(m_dstRect.y(), m_dstRect.w()), 0, result.getHeight()),
													 de::clamp(de::max(m_dstRect.x(), m_dstRect.z()), 0, result.getWidth()),
													 de::clamp(de::max(m_dstRect.y(), m_dstRect.w()), 0, result.getHeight()));
	const tcu::RGBA		baseColor		= result.getPixel(destinationArea.x(), destinationArea.y());
	const bool			signConfig		= tcu::compareThreshold(baseColor, cellColorA, threshold);

	bool				error			= false;
	tcu::Surface		errorMask		(result.getWidth(), result.getHeight());
	std::vector<bool>	horisontalSign	(destinationArea.z() - destinationArea.x());
	std::vector<bool>	verticalSign	(destinationArea.w() - destinationArea.y());

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	// Checking only area in our destination rect

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying consistency of NEAREST filtering. Verifying rect " << m_dstRect << ".\n"
		<< "Rounding direction of the NEAREST filter at the horisontal texel edge (x = n + 0.5) should not depend on the y-coordinate.\n"
		<< "Rounding direction of the NEAREST filter at the vertical texel edge (y = n + 0.5) should not depend on the x-coordinate.\n"
		<< "Blitting a grid (with uniform sized cells) should result in a grid (with non-uniform sized cells)."
		<< tcu::TestLog::EndMessage;

	// Verify that destination only contains valid colors

	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA	color	= result.getPixel(destinationArea.x() + dx, destinationArea.y() + dy);
		const bool isValidColor = tcu::compareThreshold(color, cellColorA, threshold) || tcu::compareThreshold(color, cellColorB, threshold);

		if (!isValidColor)
		{
			errorMask.setPixel(destinationArea.x() + dx, destinationArea.y() + dy, tcu::RGBA::red());
			error = true;
		}
	}
	if (error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed, destination rect contains unexpected values. "
			<< "Expected either " << cellColorA << " or " << cellColorB << "."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result",	"Result",		result)
			<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
		return false;
	}

	// Detect result edges by reading the first row and first column of the blitted area.
	// Blitting a grid should result in a grid-like image. ("sign changes" should be consistent)

	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA color = result.getPixel(destinationArea.x() + dx, destinationArea.y());

		if (tcu::compareThreshold(color, cellColorA, threshold))
			horisontalSign[dx] = true;
		else if (tcu::compareThreshold(color, cellColorB, threshold))
			horisontalSign[dx] = false;
		else
			DE_ASSERT(DE_FALSE);
	}
	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	{
		const tcu::RGBA color = result.getPixel(destinationArea.x(), destinationArea.y() + dy);

		if (tcu::compareThreshold(color, cellColorA, threshold))
			verticalSign[dy] = true;
		else if (tcu::compareThreshold(color, cellColorB, threshold))
			verticalSign[dy] = false;
		else
			DE_ASSERT(DE_FALSE);
	}

	// Verify grid-like image

	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA	color		= result.getPixel(destinationArea.x() + dx, destinationArea.y() + dy);
		const bool		resultSign	= tcu::compareThreshold(cellColorA, color, threshold);
		const bool		correctSign	= (horisontalSign[dx] == verticalSign[dy]) == signConfig;

		if (resultSign != correctSign)
		{
			errorMask.setPixel(destinationArea.x() + dx, destinationArea.y() + dy, tcu::RGBA::red());
			error = true;
		}
	}

	// Report result

	if (error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed, nearest filter is not consistent."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result",	"Result",		result)
			<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification passed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result", "Result", result)
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}